

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

uint32_t __thiscall pbrt::MultiplyGenerator(pbrt *this,span<const_unsigned_int> C,uint32_t a)

{
  uint32_t v;
  ulong uVar1;
  
  uVar1 = C.n;
  v = 0;
  while( true ) {
    if ((uint)uVar1 == 0) break;
    if ((uVar1 & 1) != 0) {
      v = v ^ *(uint *)this;
    }
    uVar1 = (ulong)((uint)uVar1 >> 1);
    this = this + 4;
  }
  return v;
}

Assistant:

PBRT_CPU_GPU inline uint32_t MultiplyGenerator(pstd::span<const uint32_t> C, uint32_t a) {
    uint32_t v = 0;
    for (int i = 0; a != 0; ++i, a >>= 1)
        if (a & 1)
            v ^= C[i];
    return v;
}